

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O2

void __thiscall Memory::HeapInfo::ScanNewImplicitRoots(HeapInfo *this)

{
  SmallLeafHeapBlock *this_00;
  SmallNormalHeapBlock *this_01;
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *this_02;
  SmallFinalizableWithBarrierHeapBlock *this_03;
  SmallFinalizableHeapBlock *this_04;
  MediumLeafHeapBlock *this_05;
  MediumNormalHeapBlock *this_06;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *this_07;
  MediumFinalizableWithBarrierHeapBlock *this_08;
  MediumFinalizableHeapBlock *this_09;
  SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *heapBlock;
  long lVar1;
  
  for (lVar1 = 0x78; lVar1 != 0xa878; lVar1 = lVar1 + 0x380) {
    HeapBucketGroup<SmallAllocationBlockAttributes>::ScanNewImplicitRoots
              ((HeapBucketGroup<SmallAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar1),this->recycler);
  }
  for (lVar1 = 0xa878; lVar1 != 0x10df8; lVar1 = lVar1 + 0x380) {
    HeapBucketGroup<MediumAllocationBlockAttributes>::ScanNewImplicitRoots
              ((HeapBucketGroup<MediumAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar1),this->recycler);
  }
  LargeHeapBucket::ScanNewImplicitRoots(&this->largeObjectBucket,this->recycler);
  for (this_00 = this->newLeafHeapBlockList;
      this_00 != (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      this_00 = SmallLeafHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock(this_00)) {
    SmallLeafHeapBlockT<SmallAllocationBlockAttributes>::ScanNewImplicitRoots
              (this_00,this->recycler);
  }
  for (this_01 = this->newNormalHeapBlockList;
      this_01 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      this_01 = SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock(this_01)) {
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanNewImplicitRoots
              (this_01,this->recycler);
  }
  for (this_02 = &this->newNormalWithBarrierHeapBlockList->
                  super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>;
      this_02 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      this_02 = &SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock
                           ((SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)
                            this_02)->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>) {
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanNewImplicitRoots
              (this_02,this->recycler);
  }
  for (this_03 = this->newFinalizableWithBarrierHeapBlockList;
      this_03 != (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      this_03 = SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock
                          (this_03)) {
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanNewImplicitRoots
              ((SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)this_03,this->recycler);
  }
  for (this_04 = this->newFinalizableHeapBlockList;
      this_04 != (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      this_04 = SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::GetNextBlock(this_04)) {
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanNewImplicitRoots
              (&this_04->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>,this->recycler)
    ;
  }
  for (this_05 = this->newMediumLeafHeapBlockList;
      this_05 != (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      this_05 = SmallLeafHeapBlockT<MediumAllocationBlockAttributes>::GetNextBlock(this_05)) {
    SmallLeafHeapBlockT<MediumAllocationBlockAttributes>::ScanNewImplicitRoots
              (this_05,this->recycler);
  }
  for (this_06 = this->newMediumNormalHeapBlockList;
      this_06 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      this_06 = SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::GetNextBlock(this_06)) {
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::ScanNewImplicitRoots
              (this_06,this->recycler);
  }
  for (this_07 = &this->newMediumNormalWithBarrierHeapBlockList->
                  super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>;
      this_07 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      this_07 = &SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>::GetNextBlock
                           ((SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)
                            this_07)->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>)
  {
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::ScanNewImplicitRoots
              (this_07,this->recycler);
  }
  for (this_08 = this->newMediumFinalizableWithBarrierHeapBlockList;
      this_08 != (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      this_08 = SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>::GetNextBlock
                          (this_08)) {
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::ScanNewImplicitRoots
              ((SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)this_08,this->recycler);
  }
  for (this_09 = this->newMediumFinalizableHeapBlockList;
      this_09 != (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      this_09 = SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::GetNextBlock(this_09))
  {
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::ScanNewImplicitRoots
              (&this_09->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>,this->recycler
              );
  }
  return;
}

Assistant:

void
HeapInfo::ScanNewImplicitRoots()
{
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].ScanNewImplicitRoots(recycler);
    }
#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].ScanNewImplicitRoots(recycler);
    }
#endif

    largeObjectBucket.ScanNewImplicitRoots(recycler);

#if ENABLE_CONCURRENT_GC

    // NOTE: need to do newLeafHeapBlockList to find new memory
    HeapBlockList::ForEach(newLeafHeapBlockList, [this](SmallLeafHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

    HeapBlockList::ForEach(newNormalHeapBlockList, [this](SmallNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

#ifdef RECYCLER_WRITE_BARRIER
    HeapBlockList::ForEach(newNormalWithBarrierHeapBlockList, [this](SmallNormalWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

    HeapBlockList::ForEach(newFinalizableWithBarrierHeapBlockList, [this](SmallFinalizableWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });
#endif

    HeapBlockList::ForEach(newFinalizableHeapBlockList, [this](SmallNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

    // NOTE: need to do newLeafHeapBlockList to find new memory
    HeapBlockList::ForEach(newMediumLeafHeapBlockList, [this](MediumLeafHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

    HeapBlockList::ForEach(newMediumNormalHeapBlockList, [this](MediumNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

#ifdef RECYCLER_WRITE_BARRIER
    HeapBlockList::ForEach(newMediumNormalWithBarrierHeapBlockList, [this](MediumNormalWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

    HeapBlockList::ForEach(newMediumFinalizableWithBarrierHeapBlockList, [this](MediumFinalizableWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });
#endif

    HeapBlockList::ForEach(newMediumFinalizableHeapBlockList, [this](MediumNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

#endif
}